

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

void * KINCreate(void)

{
  realtype rVar1;
  undefined8 *__s;
  
  __s = (undefined8 *)malloc(0x280);
  if (__s == (undefined8 *)0x0) {
    __s = (undefined8 *)0x0;
    KINProcessError((KINMem)0x0,0,"KINSOL","KINCreate","A memory request failed.");
  }
  else {
    memset(__s,0,0x280);
    *__s = 0x3cb0000000000000;
    __s[0x27] = 0;
    *(undefined4 *)(__s + 0xb) = 0;
    __s[1] = 0;
    __s[2] = 0;
    __s[0x24] = 0;
    __s[0x25] = 0;
    __s[0x2a] = 0;
    __s[0x2b] = 0;
    __s[0x2c] = 0;
    __s[0x2d] = 0;
    __s[0x2e] = 0;
    __s[0x2f] = 0;
    __s[0x30] = 0;
    __s[0x32] = 0;
    __s[0x33] = 0;
    __s[0x34] = 0;
    __s[0x35] = 0;
    __s[0x4a] = KINErrHandler;
    __s[0x4b] = __s;
    __s[0x4c] = _stderr;
    __s[0x4d] = KINInfoHandler;
    __s[0x4e] = __s;
    __s[0x4f] = _stdout;
    *(undefined4 *)((long)__s + 0x2c) = 0;
    __s[6] = 200;
    *(undefined4 *)(__s + 0x17) = 0;
    __s[7] = 10;
    *(undefined4 *)((long)__s + 100) = 0;
    __s[8] = 5;
    *(undefined4 *)((long)__s + 0x6c) = 0;
    __s[9] = 10;
    __s[0x18] = 0x4000000000000000;
    *(undefined4 *)((long)__s + 0x54) = 0;
    __s[0xf] = 0;
    __s[0x10] = 0x3e50000000000000;
    rVar1 = SUNRpowerR(2.220446049250313e-16,0.6666666666666667);
    __s[4] = rVar1;
    rVar1 = SUNRpowerR(2.220446049250313e-16,0.3333333333333333);
    __s[3] = rVar1;
    *(undefined4 *)(__s + 10) = 1;
    __s[0x14] = 0x3fb999999999999a;
    __s[0x16] = 0x4000000000000000;
    __s[0x15] = 0x3feccccccccccccd;
    *(undefined4 *)(__s + 0x49) = 0;
    *(undefined4 *)(__s + 0x45) = 1;
    __s[0x46] = 0;
    __s[0x47] = 0x3ee4f8b588e368f1;
    __s[0x48] = 0x3feccccccccccccd;
    __s[0x38] = 0x11;
    __s[0x39] = 0x16;
    __s[0x36] = 0;
    __s[0x37] = 0;
  }
  return __s;
}

Assistant:

void *KINCreate(void)
{
  KINMem kin_mem;
  realtype uround;
 
  kin_mem = NULL;
  kin_mem = (KINMem) malloc(sizeof(struct KINMemRec));
  if (kin_mem == NULL) {
    KINProcessError(kin_mem, 0, "KINSOL", "KINCreate", MSG_MEM_FAIL);
    return(NULL);
  }

  /* Zero out kin_mem */
  memset(kin_mem, 0, sizeof(struct KINMemRec));

  /* set uround (unit roundoff) */

  kin_mem->kin_uround = uround = UNIT_ROUNDOFF;
  
  /* set default values for solver optional inputs */

  kin_mem->kin_func             = NULL;
  kin_mem->kin_user_data        = NULL;
  kin_mem->kin_constraints      = NULL;
  kin_mem->kin_uscale           = NULL;
  kin_mem->kin_fscale           = NULL;
  kin_mem->kin_fold_aa          = NULL;
  kin_mem->kin_gold_aa          = NULL;
  kin_mem->kin_df_aa            = NULL;
  kin_mem->kin_dg_aa            = NULL;
  kin_mem->kin_q_aa             = NULL;
  kin_mem->kin_gamma_aa         = NULL;
  kin_mem->kin_R_aa             = NULL;
  kin_mem->kin_cv               = NULL;
  kin_mem->kin_Xv               = NULL;
  kin_mem->kin_m_aa             = ZERO;
  kin_mem->kin_aamem_aa         = 0;
  kin_mem->kin_setstop_aa       = 0;
  kin_mem->kin_constraintsSet   = SUNFALSE;
  kin_mem->kin_ehfun            = KINErrHandler;
  kin_mem->kin_eh_data          = kin_mem;
  kin_mem->kin_errfp            = stderr;
  kin_mem->kin_ihfun            = KINInfoHandler;
  kin_mem->kin_ih_data          = kin_mem;
  kin_mem->kin_infofp           = stdout;
  kin_mem->kin_printfl          = PRINTFL_DEFAULT;
  kin_mem->kin_mxiter           = MXITER_DEFAULT;
  kin_mem->kin_noInitSetup      = SUNFALSE;
  kin_mem->kin_msbset           = MSBSET_DEFAULT;
  kin_mem->kin_noResMon         = SUNFALSE;
  kin_mem->kin_msbset_sub       = MSBSET_SUB_DEFAULT;
  kin_mem->kin_update_fnorm_sub = SUNFALSE;
  kin_mem->kin_mxnbcf           = MXNBCF_DEFAULT;
  kin_mem->kin_sthrsh           = TWO;
  kin_mem->kin_noMinEps         = SUNFALSE;
  kin_mem->kin_mxnstepin        = ZERO;
  kin_mem->kin_sqrt_relfunc     = SUNRsqrt(uround);
  kin_mem->kin_scsteptol        = SUNRpowerR(uround,TWOTHIRDS);
  kin_mem->kin_fnormtol         = SUNRpowerR(uround,ONETHIRD);
  kin_mem->kin_etaflag          = KIN_ETACHOICE1;
  kin_mem->kin_eta              = POINT1;     /* default for KIN_ETACONSTANT */
  kin_mem->kin_eta_alpha        = TWO;        /* default for KIN_ETACHOICE2  */
  kin_mem->kin_eta_gamma        = POINT9;     /* default for KIN_ETACHOICE2  */
  kin_mem->kin_MallocDone       = SUNFALSE;
  kin_mem->kin_eval_omega       = SUNTRUE;
  kin_mem->kin_omega            = ZERO;       /* default to using min/max    */
  kin_mem->kin_omega_min        = OMEGA_MIN;
  kin_mem->kin_omega_max        = OMEGA_MAX;

  /* initialize lrw and liw */

  kin_mem->kin_lrw = 17;
  kin_mem->kin_liw = 22;

  /* NOTE: needed since KINInit could be called after KINSetConstraints */

  kin_mem->kin_lrw1 = 0;
  kin_mem->kin_liw1 = 0;

  return((void *) kin_mem);
}